

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::WriteXML(cmCTestLaunch *this)

{
  bool bVar1;
  char *pcVar2;
  char *local_2f0;
  cmXMLElement local_2e8;
  cmXMLElement e2;
  cmXMLWriter xml;
  cmGeneratedFileStream fxml;
  undefined1 local_30 [8];
  string logXML;
  cmCTestLaunch *this_local;
  
  logXML.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30,(string *)&this->LogDir);
  bVar1 = IsError(this);
  pcVar2 = "warning-";
  if (bVar1) {
    pcVar2 = "error-";
  }
  std::__cxx11::string::operator+=((string *)local_30,pcVar2);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&this->LogHash);
  std::__cxx11::string::operator+=((string *)local_30,".xml");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&xml.ElementOpen,(string *)local_30,false,None);
  cmXMLWriter::cmXMLWriter((cmXMLWriter *)&e2,(ostream *)&xml.ElementOpen,2);
  cmXMLElement::cmXMLElement(&local_2e8,(cmXMLWriter *)&e2,"Failure");
  bVar1 = IsError(this);
  local_2f0 = "Warning";
  if (bVar1) {
    local_2f0 = "Error";
  }
  cmXMLElement::Attribute<char_const*>(&local_2e8,"type",&local_2f0);
  WriteXMLAction(this,&local_2e8);
  WriteXMLCommand(this,&local_2e8);
  WriteXMLResult(this,&local_2e8);
  WriteXMLLabels(this,&local_2e8);
  cmXMLElement::~cmXMLElement(&local_2e8);
  cmXMLWriter::~cmXMLWriter((cmXMLWriter *)&e2);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&xml.ElementOpen);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmCTestLaunch::WriteXML()
{
  // Name the xml file.
  std::string logXML = this->LogDir;
  logXML += this->IsError() ? "error-" : "warning-";
  logXML += this->LogHash;
  logXML += ".xml";

  // Use cmGeneratedFileStream to atomically create the report file.
  cmGeneratedFileStream fxml(logXML);
  cmXMLWriter xml(fxml, 2);
  cmXMLElement e2(xml, "Failure");
  e2.Attribute("type", this->IsError() ? "Error" : "Warning");
  this->WriteXMLAction(e2);
  this->WriteXMLCommand(e2);
  this->WriteXMLResult(e2);
  this->WriteXMLLabels(e2);
}